

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O0

RotationZ<std::complex<float>_> *
qclab::qgates::operator*
          (RotationZ<std::complex<float>_> *__return_storage_ptr__,
          RotationZ<std::complex<float>_> *lhs,RotationZ<std::complex<float>_> *rhs)

{
  int iVar1;
  int iVar2;
  RotationZ<std::complex<float>_> *rhs_local;
  RotationZ<std::complex<float>_> *lhs_local;
  
  iVar1 = QGate1<std::complex<float>_>::qubit((QGate1<std::complex<float>_> *)lhs);
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationZ<std::complex<float>_>::operator*=(lhs,rhs);
    RotationZ<std::complex<float>_>::RotationZ(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZ.hpp"
                ,0xb2,"RotationZ<T> qclab::qgates::operator*(RotationZ<T>, const RotationZ<T> &)");
}

Assistant:

RotationZ< T > operator*( RotationZ< T > lhs ,
                                         const RotationZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }